

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcmc_main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *this;
  float fVar1;
  value_type vVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar8;
  char *pcVar9;
  typed_value<std::vector<float,_std::allocator<float>_>,_char> *ptVar10;
  typed_value<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_char> *ptVar11;
  typed_value<unsigned_int,_char> *ptVar12;
  size_type sVar13;
  size_type sVar14;
  ulong uVar15;
  rep rVar16;
  size_type sVar17;
  reference pvVar18;
  size_type sVar19;
  reference pvVar20;
  reference pvVar21;
  ostream *poVar22;
  reference puVar23;
  element_type *peVar24;
  reference pvVar25;
  bool bVar26;
  bool bVar27;
  bool local_1c09;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1ad8;
  uint local_1abc;
  value_type local_1ab8;
  uint r_3;
  uint max;
  uint i_2;
  undefined1 local_1aa8 [8];
  uint_vec_t memberships;
  vector<float,_std::allocator<float>_> local_1a78;
  vector<float,_std::allocator<float>_> local_1a60;
  vector<float,_std::allocator<float>_> local_1a48;
  vector<float,_std::allocator<float>_> local_1a30;
  allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_1a16;
  allocator<unsigned_int> local_1a15;
  value_type_conflict1 local_1a14;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1a10;
  undefined1 local_19f8 [8];
  uint_mat_t marginal;
  double rate;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_19c0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_19b8;
  iterator it_1;
  shared_ptr<mh_vertices_swap_ppm> local_1998;
  shared_ptr<mh_vertices_swap_sbm> local_1988;
  shared_ptr<mh_single_vertex_ppm> local_1978;
  shared_ptr<mh_single_vertex_sbm> local_1968;
  undefined1 local_1958 [8];
  shared_ptr<metropolis_hasting> algorithm;
  uint s_1;
  uint r_2;
  uint s;
  uint r_1;
  vector<float,_std::allocator<float>_> local_1930;
  undefined1 local_1918 [8];
  float_mat_t p;
  blockmodel_t blockmodel;
  uint i_1;
  uint r;
  uint shift;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_1888;
  iterator it;
  undefined1 local_1878 [4];
  uint accu;
  uint_vec_t memberships_init;
  adj_list_t adj_list;
  undefined1 local_1828 [8];
  edge_list_t edge_list;
  uint local_1808;
  uint i;
  uint N;
  uint g;
  mt19937 engine;
  duration<long,_std::ratio<1L,_1000000000L>_> local_470;
  allocator local_461;
  string local_460 [39];
  allocator local_439;
  string local_438 [39];
  allocator local_411;
  string local_410 [39];
  allocator local_3e9;
  string local_3e8 [39];
  allocator local_3c1;
  string local_3c0 [39];
  allocator local_399;
  string local_398 [39];
  allocator local_371;
  string local_370 [39];
  allocator local_349;
  string local_348 [32];
  undefined4 local_328;
  allocator local_321;
  string local_320 [32];
  string local_300 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [32];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_298;
  basic_parsed_options<char> local_278;
  variables_map local_250 [8];
  variables_map var_map;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_240 [151];
  allocator local_1a9;
  string local_1a8 [36];
  uint local_184 [3];
  undefined8 local_178;
  allocator local_169;
  string local_168 [32];
  options_description local_148 [8];
  options_description description;
  uint local_c8 [2];
  uint seed;
  allocator<float> local_b5;
  value_type_conflict local_b4;
  undefined1 local_b0 [8];
  float_vec_t cooling_schedule_kwargs;
  string cooling_schedule;
  uint local_74;
  bool maximize;
  bool use_single_vertex;
  bool use_ppm;
  bool randomize;
  uint sampling_frequency;
  uint sampling_steps;
  uint burn_in;
  uint_vec_t n;
  float_vec_t probabilities;
  string edge_list_path;
  char **argv_local;
  int argc_local;
  
  std::__cxx11::string::string
            ((string *)
             &probabilities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &n.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&sampling_steps);
  bVar4 = false;
  std::__cxx11::string::string
            ((string *)
             &cooling_schedule_kwargs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_b4 = 0.0;
  std::allocator<float>::allocator(&local_b5);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_b0,2,&local_b4,&local_b5);
  std::allocator<float>::~allocator(&local_b5);
  local_c8[0] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"Options",&local_169);
  boost::program_options::options_description::options_description
            (local_148,local_168,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  local_178 = boost::program_options::options_description::add_options();
  ptVar8 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &probabilities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_178,(value_semantic *)"edge_list_path,e",(char *)ptVar8
                             );
  ptVar10 = boost::program_options::value<std::vector<float,std::allocator<float>>>
                      ((vector<float,_std::allocator<float>_> *)
                       &n.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
  ptVar10 = boost::program_options::typed_value<std::vector<float,_std::allocator<float>_>,_char>::
            multitoken(ptVar10);
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar9,(value_semantic *)"probabilities,P",(char *)ptVar10);
  ptVar11 = boost::program_options::value<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&sampling_steps);
  ptVar11 = boost::program_options::
            typed_value<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_char>::multitoken
                      (ptVar11);
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar9,(value_semantic *)"n,n",(char *)ptVar11);
  ptVar12 = boost::program_options::value<unsigned_int>(&sampling_frequency);
  local_184[2] = 1000;
  ptVar12 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                      (ptVar12,local_184 + 2);
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar9,(value_semantic *)"burn_in,b",(char *)ptVar12);
  ptVar12 = boost::program_options::value<unsigned_int>((uint *)&maximize);
  local_184[1] = 1000;
  ptVar12 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                      (ptVar12,local_184 + 1);
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar9,(value_semantic *)"sampling_steps,t",(char *)ptVar12);
  ptVar12 = boost::program_options::value<unsigned_int>(&local_74);
  local_184[0] = 10;
  ptVar12 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                      (ptVar12,local_184);
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar9,(value_semantic *)"sampling_frequency,f",(char *)ptVar12);
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar9,"randomize,r");
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar9,"use_ppm,u");
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar9,"use_single_vertex,s");
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar9,"maximize,m");
  ptVar8 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &cooling_schedule_kwargs.super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"exponential",&local_1a9);
  ptVar8 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1a8);
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar9,(value_semantic *)"cooling_schedule,c",(char *)ptVar8);
  ptVar10 = boost::program_options::value<std::vector<float,std::allocator<float>>>
                      ((vector<float,_std::allocator<float>_> *)local_b0);
  ptVar10 = boost::program_options::typed_value<std::vector<float,_std::allocator<float>_>,_char>::
            multitoken(ptVar10);
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar9,(value_semantic *)"cooling_schedule_kwargs,a",(char *)ptVar10);
  ptVar12 = boost::program_options::value<unsigned_int>(local_c8);
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar9,(value_semantic *)"seed,d",(char *)ptVar12);
  boost::program_options::options_description_easy_init::operator()(pcVar9,"help,h");
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  boost::program_options::variables_map::variables_map(local_250);
  local_298.super_function_base.functor._8_8_ = 0;
  local_298.super_function_base.functor._16_8_ = 0;
  local_298.super_function_base.vtable = (vtable_base *)0x0;
  local_298.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function1(&local_298);
  boost::program_options::parse_command_line<char>(&local_278,argc,argv,local_148,0,&local_298);
  boost::program_options::store((basic_parsed_options *)&local_278,local_250,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_278);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_298);
  boost::program_options::notify(local_250);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"help",&local_2b9);
  sVar13 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count(local_240,(key_type *)local_2b8);
  local_1c09 = sVar13 != 0 || argc == 1;
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  if (local_1c09) {
    std::operator<<((ostream *)&std::cout,"MCMC algorithms for the SBM (final output only)\n");
    poVar22 = std::operator<<((ostream *)&std::cout,"Usage:\n");
    pcVar9 = *argv;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_320,pcVar9,&local_321);
    std::operator+((char *)local_300,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"  ");
    std::operator+(local_2e0,(char *)local_300);
    std::operator<<(poVar22,(string *)local_2e0);
    std::__cxx11::string::~string((string *)local_2e0);
    std::__cxx11::string::~string(local_300);
    std::__cxx11::string::~string(local_320);
    std::allocator<char>::~allocator((allocator<char> *)&local_321);
    boost::program_options::operator<<((ostream *)&std::cout,local_148);
    argv_local._4_4_ = 0;
    local_328 = 1;
    goto LAB_0014161c;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,"edge_list_path",&local_349);
  sVar13 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count(local_240,(key_type *)local_348);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  if (sVar13 == 0) {
    std::operator<<((ostream *)&std::cout,"edge_list_path is required (-e flag)\n");
    argv_local._4_4_ = 1;
    local_328 = 1;
    goto LAB_0014161c;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_370,"n",&local_371);
  sVar13 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count(local_240,(key_type *)local_370);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  if (sVar13 == 0) {
    std::operator<<((ostream *)&std::cout,"n is required (-n flag)\n");
    argv_local._4_4_ = 1;
    local_328 = 1;
    goto LAB_0014161c;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,"randomize",&local_399);
  sVar13 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count(local_240,(key_type *)local_398);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c0,"use_ppm",&local_3c1);
  sVar14 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count(local_240,(key_type *)local_3c0);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  bVar26 = sVar14 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e8,"use_single_vertex",&local_3e9);
  sVar14 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count(local_240,(key_type *)local_3e8);
  std::__cxx11::string::~string(local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  bVar27 = sVar14 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_410,"maximize",&local_411);
  sVar14 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count(local_240,(key_type *)local_410);
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  if (sVar14 != 0) {
    bVar4 = true;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_438,"cooling_schedule_kwargs",&local_439);
    sVar14 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::count(local_240,(key_type *)local_438);
    std::__cxx11::string::~string(local_438);
    std::allocator<char>::~allocator((allocator<char> *)&local_439);
    if (sVar14 == 0) {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &cooling_schedule_kwargs.
                               super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,"exponential");
      if (bVar3) {
        pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)local_b0,0);
        *pvVar20 = 1.0;
        pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)local_b0,1);
        *pvVar20 = 0.99;
      }
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &cooling_schedule_kwargs.
                               super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,"linear");
      if (bVar3) {
        uVar5 = _maximize + 1;
        pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)local_b0,0);
        *pvVar20 = (float)uVar5;
        pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)local_b0,1);
        *pvVar20 = 1.0;
      }
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &cooling_schedule_kwargs.
                               super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,"logarithmic");
      if (bVar3) {
        pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)local_b0,0);
        *pvVar20 = 1.0;
        pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)local_b0,1);
        *pvVar20 = 1.0;
      }
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &cooling_schedule_kwargs.
                               super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,"constant");
      if (bVar3) {
        pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)local_b0,0);
        *pvVar20 = 1.0;
      }
    }
    else {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &cooling_schedule_kwargs.
                               super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,"exponential");
      if (bVar3) {
        pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)local_b0,0);
        if (*pvVar20 <= 0.0) {
          std::operator<<((ostream *)&std::cerr,
                          "Invalid cooling schedule argument for linear schedule: T_0 must be grater than 0.\n"
                         );
          poVar22 = std::operator<<((ostream *)&std::cerr,"Passed value: T_0=");
          pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)local_b0,0);
          poVar22 = (ostream *)std::ostream::operator<<(poVar22,*pvVar20);
          std::operator<<(poVar22,"\n");
          argv_local._4_4_ = 1;
          local_328 = 1;
          goto LAB_0014161c;
        }
        pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)local_b0,1);
        if ((*pvVar20 <= 0.0) ||
           (pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)local_b0,1),
           1.0 <= *pvVar20)) {
          std::operator<<((ostream *)&std::cerr,
                          "Invalid cooling schedule argument for exponential schedule: alpha must be in ]0,1[.\n"
                         );
          poVar22 = std::operator<<((ostream *)&std::cerr,"Passed value: alpha=");
          pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)local_b0,1);
          poVar22 = (ostream *)std::ostream::operator<<(poVar22,*pvVar20);
          std::operator<<(poVar22,"\n");
          argv_local._4_4_ = 1;
          local_328 = 1;
          goto LAB_0014161c;
        }
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&cooling_schedule_kwargs.
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,"linear");
        if (bVar3) {
          pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)local_b0,0);
          if (*pvVar20 <= 0.0) {
            std::operator<<((ostream *)&std::cerr,
                            "Invalid cooling schedule argument for linear schedule: T_0 must be grater than 0.\n"
                           );
            poVar22 = std::operator<<((ostream *)&std::cerr,"Passed value: T_0=");
            pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)local_b0,0);
            poVar22 = (ostream *)std::ostream::operator<<(poVar22,*pvVar20);
            std::operator<<(poVar22,"\n");
            argv_local._4_4_ = 1;
            local_328 = 1;
            goto LAB_0014161c;
          }
          pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)local_b0,1);
          if (0.0 < *pvVar20) {
            pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)local_b0,1);
            fVar1 = *pvVar20;
            pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)local_b0,0);
            if (fVar1 < *pvVar20 || fVar1 == *pvVar20) {
              pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)local_b0,1);
              fVar1 = *pvVar20;
              uVar15 = (ulong)_maximize;
              pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)local_b0,0);
              if (*pvVar20 <= fVar1 * (float)uVar15 && fVar1 * (float)uVar15 != *pvVar20) {
                std::operator<<((ostream *)&std::cerr,
                                "Invalid cooling schedule argument for linear schedule: eta * sampling_steps must be smaller or equal to T_0.\n"
                               );
                poVar22 = std::operator<<((ostream *)&std::cerr,"Passed value: eta*sampling_steps=")
                ;
                pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                                    ((vector<float,_std::allocator<float>_> *)local_b0,1);
                poVar22 = (ostream *)std::ostream::operator<<(poVar22,*pvVar20 * (float)_maximize);
                poVar22 = std::operator<<(poVar22,", T_0=");
                pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                                    ((vector<float,_std::allocator<float>_> *)local_b0,0);
                poVar22 = (ostream *)std::ostream::operator<<(poVar22,*pvVar20);
                std::operator<<(poVar22,"\n");
                argv_local._4_4_ = 1;
                local_328 = 1;
                goto LAB_0014161c;
              }
              goto LAB_00140129;
            }
          }
          std::operator<<((ostream *)&std::cerr,
                          "Invalid cooling schedule argument for linear schedule: eta must be in ]0, T_0].\n"
                         );
          poVar22 = std::operator<<((ostream *)&std::cerr,"Passed value: T_0=");
          pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)local_b0,0);
          poVar22 = (ostream *)std::ostream::operator<<(poVar22,*pvVar20);
          poVar22 = std::operator<<(poVar22,", eta=");
          pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)local_b0,1);
          poVar22 = (ostream *)std::ostream::operator<<(poVar22,*pvVar20);
          std::operator<<(poVar22,"\n");
          argv_local._4_4_ = 1;
          local_328 = 1;
          goto LAB_0014161c;
        }
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&cooling_schedule_kwargs.
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,"logarithmic");
        if (bVar3) {
          pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)local_b0,0);
          if (*pvVar20 <= 0.0) {
            std::operator<<((ostream *)&std::cerr,
                            "Invalid cooling schedule argument for logarithmic schedule: c must be greater than 0.\n"
                           );
            poVar22 = std::operator<<((ostream *)&std::cerr,"Passed value: c=");
            pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)local_b0,0);
            poVar22 = (ostream *)std::ostream::operator<<(poVar22,*pvVar20);
            std::operator<<(poVar22,"\n");
            argv_local._4_4_ = 1;
            local_328 = 1;
            goto LAB_0014161c;
          }
          pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)local_b0,1);
          if (*pvVar20 <= 0.0) {
            std::operator<<((ostream *)&std::cerr,
                            "Invalid cooling schedule argument for logarithmic schedule: d must be greater than 0.\n"
                           );
            poVar22 = std::operator<<((ostream *)&std::cerr,"Passed value: d=");
            pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)local_b0,1);
            poVar22 = (ostream *)std::ostream::operator<<(poVar22,*pvVar20);
            std::operator<<(poVar22,"\n");
            argv_local._4_4_ = 1;
            local_328 = 1;
            goto LAB_0014161c;
          }
        }
        else {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&cooling_schedule_kwargs.
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage,"constant");
          if (!bVar3) {
            std::operator<<((ostream *)&std::cerr,
                            "Invalid cooling schedule. Options are exponential, linear, logarithmic.\n"
                           );
            argv_local._4_4_ = 1;
            local_328 = 1;
            goto LAB_0014161c;
          }
          pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)local_b0,0);
          if (*pvVar20 <= 0.0) {
            std::operator<<((ostream *)&std::cerr,
                            "Invalid cooling schedule argument for constant schedule: temperature must be greater than 0.\n"
                           );
            poVar22 = std::operator<<((ostream *)&std::cerr,"Passed value: T=");
            pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)local_b0,0);
            poVar22 = (ostream *)std::ostream::operator<<(poVar22,*pvVar20);
            std::operator<<(poVar22,"\n");
            argv_local._4_4_ = 1;
            local_328 = 1;
            goto LAB_0014161c;
          }
        }
      }
    }
  }
LAB_00140129:
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_460,"seed",&local_461);
  sVar14 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count(local_240,(key_type *)local_460);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  if (sVar14 == 0) {
    engine._M_p = std::chrono::_V2::system_clock::now();
    local_470.__r =
         (rep)std::chrono::
              time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&engine._M_p);
    rVar16 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_470);
    local_c8[0] = (uint)rVar16;
  }
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&N,(ulong)local_c8[0]);
  sVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&sampling_steps);
  uVar5 = (uint)sVar17;
  local_1808 = 0;
  for (edge_list.
       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      edge_list.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < uVar5;
      edge_list.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           edge_list.
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    pvVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&sampling_steps,
                         (ulong)edge_list.
                                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    local_1808 = *pvVar18 + local_1808;
  }
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)local_1828);
  std::__cxx11::string::string
            ((string *)
             &adj_list.
              super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (string *)
             &probabilities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  load_edge_list((edge_list_t *)local_1828,
                 (string *)
                 &adj_list.
                  super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &adj_list.
              super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  edge_to_adj((adj_list_t *)
              &memberships_init.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,(edge_list_t *)local_1828,
              local_1808);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::clear((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           *)local_1828);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1878);
  it._M_current._4_4_ = 0;
  local_1888._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&sampling_steps);
  while( true ) {
    _shift = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&sampling_steps);
    bVar3 = __gnu_cxx::operator!=
                      (&local_1888,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)&shift);
    if (!bVar3) break;
    puVar23 = __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator*(&local_1888);
    it._M_current._4_4_ = *puVar23 + it._M_current._4_4_;
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&local_1888);
  }
  r = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1878,
             (ulong)it._M_current._4_4_,&r);
  i_1 = 0;
  for (blockmodel.random_node_._M_param._M_b = 0;
      sVar19 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&sampling_steps),
      (uint)blockmodel.random_node_._M_param._M_b < sVar19;
      blockmodel.random_node_._M_param._M_b = blockmodel.random_node_._M_param._M_b + 1) {
    for (blockmodel.random_node_._M_param._M_a = 0;
        pvVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&sampling_steps,
                             (ulong)(uint)blockmodel.random_node_._M_param._M_b),
        (uint)blockmodel.random_node_._M_param._M_a < *pvVar18;
        blockmodel.random_node_._M_param._M_a = blockmodel.random_node_._M_param._M_a + 1) {
      pvVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1878,
                           (ulong)(i_1 + blockmodel.random_node_._M_param._M_a));
      *pvVar18 = blockmodel.random_node_._M_param._M_b;
    }
    pvVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&sampling_steps,
                         (ulong)(uint)blockmodel.random_node_._M_param._M_b);
    i_1 = *pvVar18 + i_1;
  }
  this = &memberships_init.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  sVar19 = std::
           vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
           ::size((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                   *)this);
  blockmodel_t::blockmodel_t
            ((blockmodel_t *)
             &p.
              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(uint_vec_t *)local_1878,uVar5,
             (uint)sVar19,(adj_list_t *)this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1878);
  if (sVar13 != 0) {
    blockmodel_t::shuffle
              ((blockmodel_t *)
               &p.
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(mt19937 *)&N);
  }
  r_1 = 0;
  std::allocator<float>::allocator((allocator<float> *)((long)&s + 3));
  std::vector<float,_std::allocator<float>_>::vector
            (&local_1930,sVar17 & 0xffffffff,(value_type_conflict *)&r_1,
             (allocator<float> *)((long)&s + 3));
  std::allocator<std::vector<float,_std::allocator<float>_>_>::allocator
            ((allocator<std::vector<float,_std::allocator<float>_>_> *)((long)&s + 2));
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *)local_1918,sVar17 & 0xffffffff,&local_1930,
           (allocator<std::vector<float,_std::allocator<float>_>_> *)((long)&s + 2));
  std::allocator<std::vector<float,_std::allocator<float>_>_>::~allocator
            ((allocator<std::vector<float,_std::allocator<float>_>_> *)((long)&s + 2));
  std::vector<float,_std::allocator<float>_>::~vector(&local_1930);
  std::allocator<float>::~allocator((allocator<float> *)((long)&s + 3));
  if (bVar26) {
    for (algorithm.super___shared_ptr<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi._4_4_ = 0;
        algorithm.super___shared_ptr<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ < uVar5;
        algorithm.super___shared_ptr<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ = algorithm.super___shared_ptr<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi._4_4_ + 1) {
      pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)
                           &n.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,0);
      vVar2 = *pvVar20;
      pvVar21 = std::
                vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                              *)local_1918,
                             (ulong)algorithm.
                                    super___shared_ptr<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi._4_4_);
      pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                          (pvVar21,(ulong)algorithm.
                                          super___shared_ptr<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi._4_4_);
      *pvVar20 = vVar2;
      algorithm.super___shared_ptr<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ._0_4_ = algorithm.super___shared_ptr<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_;
      while (algorithm.super___shared_ptr<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._0_4_ =
                  (uint)algorithm.super___shared_ptr<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi + 1,
            (uint)algorithm.super___shared_ptr<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi < uVar5) {
        pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)
                             &n.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,1);
        vVar2 = *pvVar20;
        pvVar21 = std::
                  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                *)local_1918,
                               (ulong)algorithm.
                                      super___shared_ptr<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi._4_4_);
        pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                            (pvVar21,(ulong)(uint)algorithm.
                                                  super___shared_ptr<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
        *pvVar20 = vVar2;
        pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)
                             &n.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,1);
        vVar2 = *pvVar20;
        pvVar21 = std::
                  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                *)local_1918,
                               (ulong)(uint)algorithm.
                                            super___shared_ptr<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi);
        pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                            (pvVar21,(ulong)algorithm.
                                            super___shared_ptr<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi._4_4_);
        *pvVar20 = vVar2;
      }
    }
  }
  else {
    for (r_2 = 0; r_2 < uVar5; r_2 = r_2 + 1) {
      for (s_1 = 0; s_1 < uVar5; s_1 = s_1 + 1) {
        pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)
                             &n.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (ulong)(s_1 + r_2 * uVar5));
        vVar2 = *pvVar20;
        pvVar21 = std::
                  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                *)local_1918,(ulong)r_2);
        pvVar20 = std::vector<float,_std::allocator<float>_>::operator[](pvVar21,(ulong)s_1);
        *pvVar20 = vVar2;
      }
    }
  }
  std::shared_ptr<metropolis_hasting>::shared_ptr((shared_ptr<metropolis_hasting> *)local_1958);
  if ((bVar26) || (!bVar27)) {
    if ((bVar26) && (bVar27)) {
      std::make_shared<mh_single_vertex_ppm>();
      std::shared_ptr<metropolis_hasting>::operator=
                ((shared_ptr<metropolis_hasting> *)local_1958,&local_1978);
      std::shared_ptr<mh_single_vertex_ppm>::~shared_ptr(&local_1978);
    }
    else if ((bVar26) || (bVar27)) {
      if ((bVar26) && (!bVar27)) {
        std::make_shared<mh_vertices_swap_ppm>();
        std::shared_ptr<metropolis_hasting>::operator=
                  ((shared_ptr<metropolis_hasting> *)local_1958,&local_1998);
        std::shared_ptr<mh_vertices_swap_ppm>::~shared_ptr(&local_1998);
      }
    }
    else {
      std::make_shared<mh_vertices_swap_sbm>();
      std::shared_ptr<metropolis_hasting>::operator=
                ((shared_ptr<metropolis_hasting> *)local_1958,&local_1988);
      std::shared_ptr<mh_vertices_swap_sbm>::~shared_ptr(&local_1988);
    }
  }
  else {
    std::make_shared<mh_single_vertex_sbm>();
    std::shared_ptr<metropolis_hasting>::operator=
              ((shared_ptr<metropolis_hasting> *)local_1958,&local_1968);
    std::shared_ptr<mh_single_vertex_sbm>::~shared_ptr(&local_1968);
  }
  poVar22 = std::operator<<((ostream *)&std::clog,"edge_list_path: ");
  poVar22 = std::operator<<(poVar22,(string *)
                                    &probabilities.super__Vector_base<float,_std::allocator<float>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::operator<<(poVar22,"\n");
  std::operator<<((ostream *)&std::clog,"probabilities:\n");
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *)&it_1,(vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     *)local_1918);
  output_mat<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>>
            ((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)&it_1,(ostream *)&std::clog);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)&it_1);
  poVar22 = std::operator<<((ostream *)&std::clog,"sizes (g=");
  sVar19 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&sampling_steps);
  poVar22 = (ostream *)std::ostream::operator<<(poVar22,sVar19);
  std::operator<<(poVar22,"): ");
  local_19b8._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&sampling_steps);
  while( true ) {
    local_19c0._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&sampling_steps);
    bVar3 = __gnu_cxx::operator!=(&local_19b8,&local_19c0);
    if (!bVar3) break;
    puVar23 = __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator*(&local_19b8);
    poVar22 = (ostream *)std::ostream::operator<<(&std::clog,*puVar23);
    std::operator<<(poVar22," ");
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&local_19b8);
  }
  std::operator<<((ostream *)&std::clog,"\n");
  poVar22 = std::operator<<((ostream *)&std::clog,"burn_in: ");
  poVar22 = (ostream *)std::ostream::operator<<(poVar22,sampling_frequency);
  std::operator<<(poVar22,"\n");
  poVar22 = std::operator<<((ostream *)&std::clog,"sampling_steps: ");
  poVar22 = (ostream *)std::ostream::operator<<(poVar22,_maximize);
  std::operator<<(poVar22,"\n");
  poVar22 = std::operator<<((ostream *)&std::clog,"sampling_frequency: ");
  poVar22 = (ostream *)std::ostream::operator<<(poVar22,local_74);
  std::operator<<(poVar22,"\n");
  if (bVar4) {
    std::operator<<((ostream *)&std::clog,"maximize: true\n");
  }
  else {
    std::operator<<((ostream *)&std::clog,"maximize: false\n");
  }
  if (bVar26) {
    std::operator<<((ostream *)&std::clog,"use_ppm: true\n");
  }
  else {
    std::operator<<((ostream *)&std::clog,"use_ppm: false\n");
  }
  if (bVar27) {
    std::operator<<((ostream *)&std::clog,"use_single_vertex: true\n");
  }
  else {
    std::operator<<((ostream *)&std::clog,"use_single_vertex: false\n");
  }
  if (sVar13 != 0) {
    std::operator<<((ostream *)&std::clog,"randomize: true\n");
  }
  else {
    std::operator<<((ostream *)&std::clog,"randomize: false\n");
  }
  if (bVar4) {
    poVar22 = std::operator<<((ostream *)&std::clog,"cooling_schedule: ");
    poVar22 = std::operator<<(poVar22,(string *)
                                      &cooling_schedule_kwargs.
                                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar22,"\n");
    std::operator<<((ostream *)&std::clog,"cooling_schedule_kwargs: ");
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&rate,
               (vector<float,_std::allocator<float>_> *)local_b0);
    output_vec<std::vector<float,std::allocator<float>>>
              ((vector<float,_std::allocator<float>_> *)&rate,(ostream *)&std::clog);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)&rate);
  }
  poVar22 = std::operator<<((ostream *)&std::clog,"seed: ");
  poVar22 = (ostream *)std::ostream::operator<<(poVar22,local_c8[0]);
  std::operator<<(poVar22,"\n");
  marginal.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar19 = std::
           vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
           ::size((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                   *)&memberships_init.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  local_1a14 = 0;
  std::allocator<unsigned_int>::allocator(&local_1a15);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_1a10,sVar17 & 0xffffffff,&local_1a14,&local_1a15);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator(&local_1a16);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_19f8,sVar19,&local_1a10,&local_1a16);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator(&local_1a16)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1a10);
  std::allocator<unsigned_int>::~allocator(&local_1a15);
  if (bVar4) {
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &cooling_schedule_kwargs.
                             super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,"exponential");
    if (bVar4) {
      peVar24 = std::
                __shared_ptr_access<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1958);
      std::vector<float,_std::allocator<float>_>::vector
                (&local_1a30,(vector<float,_std::allocator<float>_> *)local_b0);
      metropolis_hasting::anneal
                (peVar24,(blockmodel_t *)
                         &p.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (float_mat_t *)local_1918,exponential_schedule,&local_1a30,_maximize,(mt19937 *)&N)
      ;
      std::vector<float,_std::allocator<float>_>::~vector(&local_1a30);
    }
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &cooling_schedule_kwargs.
                             super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,"linear");
    if (bVar4) {
      peVar24 = std::
                __shared_ptr_access<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1958);
      std::vector<float,_std::allocator<float>_>::vector
                (&local_1a48,(vector<float,_std::allocator<float>_> *)local_b0);
      metropolis_hasting::anneal
                (peVar24,(blockmodel_t *)
                         &p.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (float_mat_t *)local_1918,linear_schedule,&local_1a48,_maximize,(mt19937 *)&N);
      std::vector<float,_std::allocator<float>_>::~vector(&local_1a48);
    }
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &cooling_schedule_kwargs.
                             super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,"logarithmic");
    if (bVar4) {
      peVar24 = std::
                __shared_ptr_access<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1958);
      std::vector<float,_std::allocator<float>_>::vector
                (&local_1a60,(vector<float,_std::allocator<float>_> *)local_b0);
      metropolis_hasting::anneal
                (peVar24,(blockmodel_t *)
                         &p.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (float_mat_t *)local_1918,logarithmic_schedule,&local_1a60,_maximize,(mt19937 *)&N)
      ;
      std::vector<float,_std::allocator<float>_>::~vector(&local_1a60);
    }
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &cooling_schedule_kwargs.
                             super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,"constant");
    if (bVar4) {
      peVar24 = std::
                __shared_ptr_access<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1958);
      std::vector<float,_std::allocator<float>_>::vector
                (&local_1a78,(vector<float,_std::allocator<float>_> *)local_b0);
      metropolis_hasting::anneal
                (peVar24,(blockmodel_t *)
                         &p.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (float_mat_t *)local_1918,constant_schedule,&local_1a78,_maximize,(mt19937 *)&N);
      std::vector<float,_std::allocator<float>_>::~vector(&local_1a78);
    }
    blockmodel_t::get_memberships
              ((uint_vec_t *)
               &memberships.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (blockmodel_t *)
               &p.
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    output_vec<std::vector<unsigned_int,std::allocator<unsigned_int>>>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &memberships.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(ostream *)&std::cout);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &memberships.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  else {
    peVar24 = std::__shared_ptr_access<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1958);
    marginal.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)metropolis_hasting::marginalize
                            (peVar24,(blockmodel_t *)
                                     &p.
                                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (uint_mat_t *)local_19f8,(float_mat_t *)local_1918,sampling_frequency,
                             local_74,_maximize,(mt19937 *)&N);
    uVar6 = blockmodel_t::get_N((blockmodel_t *)
                                &p.
                                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    i_2 = 0;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&max + 3));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1aa8,(ulong)uVar6,&i_2,
               (allocator<unsigned_int> *)((long)&max + 3));
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&max + 3));
    for (r_3 = 0; uVar6 = r_3,
        uVar7 = blockmodel_t::get_N((blockmodel_t *)
                                    &p.
                                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage),
        uVar6 < uVar7; r_3 = r_3 + 1) {
      local_1ab8 = 0;
      for (local_1abc = 0; local_1abc < uVar5; local_1abc = local_1abc + 1) {
        pvVar25 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                *)local_19f8,(ulong)r_3);
        pvVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (pvVar25,(ulong)local_1abc);
        uVar6 = local_1abc;
        if (local_1ab8 < *pvVar18) {
          pvVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1aa8,
                               (ulong)r_3);
          *pvVar18 = uVar6;
          pvVar25 = std::
                    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                  *)local_19f8,(ulong)r_3);
          pvVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (pvVar25,(ulong)local_1abc);
          local_1ab8 = *pvVar18;
        }
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_1ad8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1aa8);
    output_vec<std::vector<unsigned_int,std::allocator<unsigned_int>>>
              (&local_1ad8,(ostream *)&std::cout);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1ad8);
    poVar22 = std::operator<<((ostream *)&std::clog,"acceptance ratio ");
    poVar22 = (ostream *)
              std::ostream::operator<<
                        (poVar22,(double)marginal.
                                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar22,"\n");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1aa8);
  }
  argv_local._4_4_ = 0;
  local_328 = 1;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_19f8);
  std::shared_ptr<metropolis_hasting>::~shared_ptr((shared_ptr<metropolis_hasting> *)local_1958);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)local_1918);
  blockmodel_t::~blockmodel_t
            ((blockmodel_t *)
             &p.
              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1878);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)&memberships_init.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             *)local_1828);
LAB_0014161c:
  boost::program_options::variables_map::~variables_map(local_250);
  boost::program_options::options_description::~options_description(local_148);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_b0);
  std::__cxx11::string::~string
            ((string *)
             &cooling_schedule_kwargs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&sampling_steps);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &n.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &probabilities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char const *argv[]) {
    /* ~~~~~ Program options ~~~~~~~*/
    std::string edge_list_path;
    float_vec_t probabilities;
    uint_vec_t n;
    unsigned int burn_in;
    unsigned int sampling_steps;
    unsigned int sampling_frequency;
    bool randomize = false;
    bool use_ppm = false;
    bool use_single_vertex = false;
    bool maximize = false;
    std::string cooling_schedule;
    float_vec_t cooling_schedule_kwargs(2,0);
    unsigned int seed = 0;

    po::options_description description("Options");
    description.add_options()
    ("edge_list_path,e", po::value<std::string>(&edge_list_path), 
        "Path to edge list file.")
    ("probabilities,P", po::value<float_vec_t>(&probabilities)->multitoken(), 
        "In normal mode (SBM): probability matrix in row major order. In PPM mode: p_in followed by p_out.")
    ("n,n", po::value<uint_vec_t>(&n)->multitoken(), 
        "Block sizes vector.\n")
    ("burn_in,b", po::value<unsigned int>(&burn_in)->default_value(1000),
        "Burn-in time.")
    ("sampling_steps,t", po::value<unsigned int>(&sampling_steps)->default_value(1000),
        "Number of sampling steps in marginalize mode. Length of the simulated annealing process.")
    ("sampling_frequency,f", po::value<unsigned int>(&sampling_frequency)->default_value(10),
        "Number of step between each sample in marginalize mode. Unused in likelihood maximization mode.")
    ("randomize,r",
        "Randomize initial block state.")
    ("use_ppm,u",
        "Use PPM transition ratios (defaults to SBM).")
    ("use_single_vertex,s",
        "Use single vertex proposal distribution (defaults to vertices swap).")
    ("maximize,m",
        "Maximize likelihood instead of marginalizing.")
    ("cooling_schedule,c", po::value<std::string>(&cooling_schedule)->default_value("exponential"),
        "Cooling schedule for the simulated annealing algorithm. Options are exponential, linear, logarithmic and constant.")
    ("cooling_schedule_kwargs,a", po::value<float_vec_t>(&cooling_schedule_kwargs)->multitoken(),
        "Additional arguments for the cooling schedule provided as a list of floats. "\
        "Depends on the choice of schedule:\n"\
         "Exponential: T_0 (init. temperature > 0)\n"\
         "             alpha (in ]0,1[).\n"\
         "Linear: T_0 (init. temperature > 0)\n"\
         "        eta (rate of decline).\n"\
         "Logarithmic: c (rate of decline)\n"\
         "             d (delay > 1)\n"\
         "Constant: T (temperature > 0)")
    ("seed,d", po::value<unsigned int>(&seed),
        "Seed of the pseudo random number generator (Mersenne-twister 19937). A random seed is used if seed is not specified.")
    ("help,h", "Produce this help message.")
    ;
    po::variables_map var_map;
    po::store(po::parse_command_line(argc,argv,description), var_map);
    po::notify(var_map);
    if (var_map.count("help") > 0 || argc == 1) {
	#if OUTPUT_HISTORY == 0
		std::cout << "MCMC algorithms for the SBM (final output only)\n";
       	#else
		std::cout << "MCMC algorithms for the SBM (output intermediate states)\n";
	#endif
	std::cout << "Usage:\n"
                  << "  "+std::string(argv[0])+" [--option_1=value] [--option_s2=value] ...\n";
        std::cout << description;
        return 0;
    }
    if (var_map.count("edge_list_path") == 0) {
        std::cout << "edge_list_path is required (-e flag)\n";
        return 1;
    }
    if (var_map.count("n") == 0) {
        std::cout << "n is required (-n flag)\n";
        return 1;
    }
    if (var_map.count("randomize") > 0) {
        randomize = true;
    }
    if (var_map.count("use_ppm") > 0) {
        use_ppm = true;
    }
    if (var_map.count("use_single_vertex") > 0) {
        use_single_vertex = true;
    }
    if (var_map.count("maximize") > 0) {
        maximize = true;
        if (var_map.count("cooling_schedule_kwargs") == 0)
        {
          // defaults
          if (cooling_schedule == "exponential")
          {
            cooling_schedule_kwargs[0] = 1;
            cooling_schedule_kwargs[1] = 0.99;
          } 
          if (cooling_schedule == "linear")
          {
            cooling_schedule_kwargs[0] = sampling_steps + 1;
            cooling_schedule_kwargs[1] = 1;
          }
          if (cooling_schedule == "logarithmic")
          {
            cooling_schedule_kwargs[0] = 1;
            cooling_schedule_kwargs[1] = 1;
          }
          if (cooling_schedule == "constant")
          {
            cooling_schedule_kwargs[0] = 1;
          }
        }
        else
        {
          // kwards not defaulted, must check.
          if (cooling_schedule == "exponential")
          {
            if (cooling_schedule_kwargs[0] <= 0)
            {
              std::cerr << "Invalid cooling schedule argument for linear schedule: T_0 must be grater than 0.\n";
              std::cerr << "Passed value: T_0=" << cooling_schedule_kwargs[0] << "\n";
              return 1;
            }
            if (cooling_schedule_kwargs[1] <= 0 || cooling_schedule_kwargs[1] >= 1)
            {
              std::cerr << "Invalid cooling schedule argument for exponential schedule: alpha must be in ]0,1[.\n";
              std::cerr << "Passed value: alpha=" << cooling_schedule_kwargs[1] << "\n";
              return 1;
            }
          }
          else if (cooling_schedule == "linear")
          {
            if (cooling_schedule_kwargs[0] <= 0)
            {
              std::cerr << "Invalid cooling schedule argument for linear schedule: T_0 must be grater than 0.\n";
              std::cerr << "Passed value: T_0=" << cooling_schedule_kwargs[0] << "\n";
              return 1;
            }
            if (cooling_schedule_kwargs[1] <= 0 || cooling_schedule_kwargs[1] > cooling_schedule_kwargs[0])
            {
              std::cerr << "Invalid cooling schedule argument for linear schedule: eta must be in ]0, T_0].\n";
              std::cerr << "Passed value: T_0=" << cooling_schedule_kwargs[0]
                        << ", eta=" << cooling_schedule_kwargs[1] << "\n";
              return 1;
            }
            if (cooling_schedule_kwargs[1] * sampling_steps > cooling_schedule_kwargs[0])
            {
              std::cerr << "Invalid cooling schedule argument for linear schedule: eta * sampling_steps must be smaller or equal to T_0.\n";
              std::cerr << "Passed value: eta*sampling_steps=" << cooling_schedule_kwargs[1] * sampling_steps
                        << ", T_0=" << cooling_schedule_kwargs[0] << "\n";
              return 1;
            }
          }
          else if (cooling_schedule == "logarithmic")
          {
            if (cooling_schedule_kwargs[0] <= 0)
            {
              std::cerr << "Invalid cooling schedule argument for logarithmic schedule: c must be greater than 0.\n";
              std::cerr << "Passed value: c=" << cooling_schedule_kwargs[0] << "\n";
              return 1;
            }
            if (cooling_schedule_kwargs[1] <= 0)
            {
              std::cerr << "Invalid cooling schedule argument for logarithmic schedule: d must be greater than 0.\n";
              std::cerr << "Passed value: d=" << cooling_schedule_kwargs[1] << "\n";
              return 1;
            }
          }
          else if (cooling_schedule == "constant")
          {
            if (cooling_schedule_kwargs[0] <= 0)
            {
              std::cerr << "Invalid cooling schedule argument for constant schedule: temperature must be greater than 0.\n";
              std::cerr << "Passed value: T=" << cooling_schedule_kwargs[0] << "\n";
              return 1;
            }
          }
          else
          {
            std::cerr << "Invalid cooling schedule. Options are exponential, linear, logarithmic.\n";
            return 1;
          }
        }
    }
    if (var_map.count("seed") == 0) {
        // seeding based on the clock
        seed = (unsigned int) std::chrono::high_resolution_clock::now().time_since_epoch().count();
    }
    /* ~~~~~ Setup objects ~~~~~~~*/
    std::mt19937 engine(seed);
    // number of blocks
    unsigned int g = n.size();
    // number of vertices
    unsigned int N = 0;
    for (unsigned int i = 0; i < g; ++i) {
      N += n[i];
    }
    // Graph structure
    edge_list_t edge_list;
    load_edge_list(edge_list, edge_list_path);
    adj_list_t adj_list = edge_to_adj(edge_list, N);
    edge_list.clear();
    // memberships from block sizes
    uint_vec_t memberships_init;
    {
      unsigned int accu = 0;
      for (auto it = n.begin(); it != n.end(); ++it) {
          accu += *it;
      }
      memberships_init.resize(accu, 0);
      unsigned shift = 0;
      for (unsigned int r = 0; r < n.size(); ++r) {
          for (unsigned int i = 0; i < n[r]; ++i) {
              memberships_init[shift + i] = r;
          }
          shift += n[r];
      }
    }
    // blockmodel
    blockmodel_t blockmodel(memberships_init, g, adj_list.size(), &adj_list);
    memberships_init.clear();
    if (randomize) {
        blockmodel.shuffle(engine);
    }
    // probabilities
    float_mat_t p(g, float_vec_t(g, 0));
    if (!use_ppm)
    {
      for (unsigned int r = 0; r < g; ++r)
      {
        for (unsigned int s = 0; s < g; ++s)
        {
          p[r][s] = probabilities[s + r*g];
        }
      }
    }
    else
    {
      for (unsigned int r = 0; r < g; ++r)
      {
        p[r][r] = probabilities[0];
        for (unsigned int s = r + 1; s < g; ++s)
        {
          p[r][s] = probabilities[1];
          p[s][r] = probabilities[1];
        }
      }
    }
    // Bind proper Metropolis-Hasting algorithm
    std::shared_ptr<metropolis_hasting> algorithm;
    if (!use_ppm && use_single_vertex) {
        algorithm = std::make_shared<mh_single_vertex_sbm>();
    }
    else if (use_ppm && use_single_vertex) {
        algorithm = std::make_shared<mh_single_vertex_ppm>();    
    }
    else if (!use_ppm &&  !use_single_vertex) {
        algorithm = std::make_shared<mh_vertices_swap_sbm>();     
    }
    else if (use_ppm && !use_single_vertex) {
        algorithm = std::make_shared<mh_vertices_swap_ppm>();     
    }

    /* ~~~~~ Logging ~~~~~~~*/
    #if LOGGING == 1
    std::clog << "edge_list_path: " << edge_list_path << "\n";
    std::clog << "probabilities:\n";
    output_mat<float_mat_t>(p, std::clog);
    std::clog << "sizes (g=" << n.size() << "): ";
    for (auto it = n.begin(); it != n.end(); ++it)
        std::clog << *it << " ";
    std::clog << "\n";
    std::clog << "burn_in: " << burn_in << "\n";
    std::clog << "sampling_steps: " << sampling_steps << "\n";
    std::clog << "sampling_frequency: " << sampling_frequency << "\n";
    if (maximize) {std::clog << "maximize: true\n";}
    else {std::clog << "maximize: false\n";}
    if (use_ppm) {std::clog << "use_ppm: true\n";}
    else {std::clog << "use_ppm: false\n";}
    if (use_single_vertex) {std::clog << "use_single_vertex: true\n";}
    else {std::clog << "use_single_vertex: false\n";}
    if (randomize) {std::clog << "randomize: true\n";}
    else {std::clog << "randomize: false\n";}
    if (maximize)
    {
      std::clog << "cooling_schedule: " << cooling_schedule << "\n";
      std::clog << "cooling_schedule_kwargs: ";
      output_vec<float_vec_t>(cooling_schedule_kwargs);
    }
    std::clog << "seed: " << seed << "\n";
    #endif

    /* ~~~~~ Actual algorithm ~~~~~~~*/
    double rate = 0;
    uint_mat_t marginal(adj_list.size(), uint_vec_t(g, 0));
    if (maximize)
    {
      if (cooling_schedule == "exponential")
      {
        algorithm->anneal(blockmodel, p, &exponential_schedule, cooling_schedule_kwargs, sampling_steps, engine);
      }
      if (cooling_schedule == "linear")
      {
        algorithm->anneal(blockmodel, p, &linear_schedule, cooling_schedule_kwargs, sampling_steps, engine);
      }
      if (cooling_schedule == "logarithmic")
      {
        algorithm->anneal(blockmodel, p, &logarithmic_schedule, cooling_schedule_kwargs, sampling_steps, engine);
      }
      if (cooling_schedule == "constant")
      {
        algorithm->anneal(blockmodel, p, &constant_schedule, cooling_schedule_kwargs, sampling_steps, engine);
      }
      output_vec<uint_vec_t>(blockmodel.get_memberships(), std::cout);
    }
    else  // marginalize
    {  
      rate = algorithm->marginalize(blockmodel, marginal, p, burn_in, sampling_frequency, sampling_steps, engine);
      uint_vec_t memberships(blockmodel.get_N(), 0);
      for (unsigned int i = 0; i < blockmodel.get_N(); ++i)
      {
        unsigned int max = 0;
        for (unsigned int r = 0; r < g; ++r)
        {
          if (marginal[i][r] > max)
          {
            memberships[i] = r;
            max = marginal[i][r];
          }
        }
      }
      output_vec<uint_vec_t>(memberships, std::cout);
      std::clog << "acceptance ratio " <<  rate  <<  "\n";
    }
    return 0;
}